

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error ps_parser_load_field
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte FVar1;
  FT_Byte *pFVar2;
  FT_Byte *pFVar3;
  void *pvVar4;
  FT_Memory pFVar5;
  FT_Fixed *pFVar6;
  PS_Parser pPVar7;
  byte bVar8;
  uint uVar9;
  FT_Int FVar10;
  FT_Pointer pvVar11;
  FT_Fixed FVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  FT_Long power_ten;
  T1_Field pTVar16;
  void **ppvVar17;
  T1_FieldType TVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  byte *pbVar22;
  byte *pbVar23;
  uint max_values;
  FT_Byte *cur;
  T1_TokenRec token2;
  T1_TokenRec token;
  byte *local_e0;
  FT_Error local_d4;
  T1_Field local_d0;
  void **local_c8;
  int local_bc;
  FT_Memory local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  PS_Parser local_98;
  T1_TokenType local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  T1_TokenRec_ local_68;
  FT_Fixed local_50;
  T1_TokenRec_ local_48;
  
  uVar21 = (ulong)max_objects;
  local_98 = parser;
  ps_parser_to_token(parser,&local_48);
  pPVar7 = local_98;
  if (local_48.type == T1_TOKEN_TYPE_NONE) {
    return 3;
  }
  local_e0 = local_48.start;
  TVar18 = field->type;
  local_8c = local_48.type;
  pbVar22 = local_48.limit;
  local_d0 = field;
  local_c8 = objects;
  local_a8 = uVar21;
  if (TVar18 == T1_FIELD_TYPE_BBOX) {
    pFVar2 = local_98->cursor;
    pFVar3 = local_98->limit;
    local_98->cursor = local_48.start + 1;
    local_98->limit = local_48.limit + -1;
    ps_parser_to_token(local_98,&local_68);
    pPVar7->cursor = pFVar2;
    pPVar7->limit = pFVar3;
    uVar21 = 1;
    if (local_68.type == T1_TOKEN_TYPE_ARRAY) {
      if ((int)local_a8 == 0) {
        return 3;
      }
      TVar18 = T1_FIELD_TYPE_MM_BBOX;
      lVar19 = 1;
      pbVar22 = local_48.limit + -1;
      local_e0 = local_48.start + 1;
    }
    else {
      lVar19 = 0;
      TVar18 = T1_FIELD_TYPE_BBOX;
    }
  }
  else if (local_48.type == T1_TOKEN_TYPE_ARRAY) {
    if (max_objects == 0) {
      return 3;
    }
    lVar19 = 1;
    pbVar22 = local_48.limit + -1;
    local_e0 = local_48.start + 1;
  }
  else {
    uVar21 = 1;
    lVar19 = 0;
  }
  iVar20 = (int)local_a8;
  local_80 = (ulong)(uint)(iVar20 * 4);
  local_70 = (ulong)(uint)(iVar20 * 2);
  local_78 = (ulong)(uint)(iVar20 * 3);
  local_88 = local_a8 & 0xffffffff;
  uVar13 = (ulong)(TVar18 - T1_FIELD_TYPE_BOOL);
  pTVar16 = local_d0;
  ppvVar17 = local_c8;
  local_b0 = uVar13;
LAB_0022ca33:
  iVar20 = (int)uVar21;
  do {
    if ((pbVar22 <= local_e0) || (uVar21 = (ulong)*local_e0, 0x25 < uVar21)) break;
    if ((0x100003601U >> (uVar21 & 0x3f) & 1) == 0) {
      if (uVar21 != 0x25) break;
      bVar8 = 0x25;
      while (((pbVar23 = local_e0 + 1, bVar8 != 10 && (bVar8 != 0xd)) &&
             (local_e0 = pbVar22, pbVar23 != pbVar22))) {
        bVar8 = *pbVar23;
        local_e0 = pbVar23;
      }
    }
    local_e0 = local_e0 + 1;
  } while( true );
  pvVar4 = ppvVar17[lVar19];
  uVar21 = (ulong)pTVar16->offset;
  if (7 < (uint)uVar13) {
    return 3;
  }
  switch((long)&switchD_0022caa7::switchdataD_002f6520 +
         (long)(int)(&switchD_0022caa7::switchdataD_002f6520)[uVar13]) {
  case 0x22caa9:
    if (local_e0 < pbVar22) {
      pFVar5 = local_98->memory;
      iVar14 = (int)pbVar22 - (int)local_e0;
      if (local_8c == T1_TOKEN_TYPE_STRING) {
        uVar9 = iVar14 - 2;
      }
      else {
        if (local_8c != T1_TOKEN_TYPE_KEY) {
          return 3;
        }
        uVar9 = iVar14 - 1;
      }
      local_b8 = (FT_Memory)(ulong)uVar9;
      pbVar23 = local_e0 + 1;
      local_e0 = pbVar23;
      local_bc = iVar20;
      local_a0 = lVar19;
      if (*(void **)((long)pvVar4 + uVar21) != (void *)0x0) {
        ft_mem_free(pFVar5,*(void **)((long)pvVar4 + uVar21));
        uVar9 = (uint)local_b8;
        *(undefined8 *)((long)pvVar4 + uVar21) = 0;
      }
      pvVar11 = ft_mem_qalloc(pFVar5,(ulong)(uVar9 + 1),&local_d4);
      if (local_d4 != 0) {
        return local_d4;
      }
      uVar13 = (ulong)local_b8 & 0xffffffff;
      memcpy(pvVar11,pbVar23,uVar13);
      *(undefined1 *)((long)pvVar11 + uVar13) = 0;
      *(FT_Pointer *)((long)pvVar4 + uVar21) = pvVar11;
      pTVar16 = local_d0;
      ppvVar17 = local_c8;
      uVar13 = local_b0;
      lVar19 = local_a0;
      iVar20 = local_bc;
    }
    goto LAB_0022ce8f;
  case 0x22caf0:
    power_ten = 0;
    goto LAB_0022cc91;
  case 0x22cb02:
    pFVar5 = local_98->memory;
    local_bc = iVar20;
    local_a0 = lVar19;
    pvVar11 = ft_mem_qrealloc(pFVar5,8,0,local_80,(void *)0x0,&local_d4);
    uVar21 = local_a8;
    if (local_d4 != 0) {
      return local_d4;
    }
    lVar19 = 0;
    local_b8 = pFVar5;
LAB_0022cb52:
    max_values = (uint)uVar21;
    uVar9 = ps_tofixedarray(&local_e0,pbVar22,max_values,
                            (FT_Fixed *)((ulong)((int)lVar19 * max_values) * 8 + (long)pvVar11),0);
    uVar13 = local_88;
    ppvVar17 = local_c8;
    if (((int)uVar9 < 0) || (uVar9 < max_values)) {
      local_d4 = 3;
      ft_mem_free(local_b8,pvVar11);
      return local_d4;
    }
    do {
      if ((pbVar22 <= local_e0) || (uVar15 = (ulong)*local_e0, 0x25 < uVar15)) goto LAB_0022cbd2;
      if ((0x100003601U >> (uVar15 & 0x3f) & 1) == 0) {
        if (uVar15 != 0x25) goto LAB_0022cbd2;
        bVar8 = 0x25;
        while (((pbVar23 = local_e0 + 1, bVar8 != 10 && (bVar8 != 0xd)) &&
               (local_e0 = pbVar22, pbVar23 != pbVar22))) {
          bVar8 = *pbVar23;
          local_e0 = pbVar23;
        }
      }
      local_e0 = local_e0 + 1;
    } while( true );
  case 0x22cc81:
    power_ten = 3;
LAB_0022cc91:
    FVar12 = PS_Conv_ToFixed(&local_e0,pbVar22,power_ten);
    pTVar16 = local_d0;
    ppvVar17 = local_c8;
    break;
  case 0x22cc9b:
    pbVar23 = local_e0 + 3;
    if (((pbVar23 < pbVar22) && (*local_e0 == 0x74)) &&
       ((local_e0[1] == 0x72 && ((local_e0[2] == 0x75 && (*pbVar23 == 0x65)))))) {
      local_e0 = local_e0 + 5;
      FVar12 = 1;
    }
    else {
      if ((local_e0 + 4 < pbVar22) &&
         ((((*local_e0 == 0x66 && (local_e0[1] == 0x61)) && (local_e0[2] == 0x6c)) &&
          ((*pbVar23 == 0x73 && (local_e0[4] == 0x65)))))) {
        local_e0 = local_e0 + 6;
      }
      FVar12 = 0;
    }
    break;
  case 0x22cce0:
    FVar12 = PS_Conv_ToInt(&local_e0,pbVar22);
    pTVar16 = local_d0;
    ppvVar17 = local_c8;
    break;
  case 0x22cd08:
    FVar10 = ps_tofixedarray(&local_e0,pbVar22,4,(FT_Fixed *)&local_68,0);
    if (FVar10 < 4) {
      return 3;
    }
    FVar12 = FT_RoundFix((FT_Fixed)local_68.start);
    *(FT_Fixed *)((long)pvVar4 + uVar21) = FVar12;
    FVar12 = FT_RoundFix((FT_Fixed)local_68.limit);
    *(FT_Fixed *)((long)pvVar4 + uVar21 + 8) = FVar12;
    FVar12 = FT_RoundFix(CONCAT44(local_68._20_4_,local_68.type));
    *(FT_Fixed *)((long)pvVar4 + uVar21 + 0x10) = FVar12;
    FVar12 = FT_RoundFix(local_50);
    *(FT_Fixed *)((long)pvVar4 + uVar21 + 0x18) = FVar12;
    pTVar16 = local_d0;
    ppvVar17 = local_c8;
    uVar13 = local_b0;
    goto LAB_0022ce8f;
  }
  FVar1 = pTVar16->size;
  uVar13 = local_b0;
  if (FVar1 == '\x04') {
    *(int *)((long)pvVar4 + uVar21) = (int)FVar12;
  }
  else if (FVar1 == '\x02') {
    *(short *)((long)pvVar4 + uVar21) = (short)FVar12;
  }
  else if (FVar1 == '\x01') {
    *(char *)((long)pvVar4 + uVar21) = (char)FVar12;
  }
  else {
    *(FT_Fixed *)((long)pvVar4 + uVar21) = FVar12;
  }
LAB_0022ce8f:
  lVar19 = lVar19 + 1;
  uVar21 = (ulong)(iVar20 - 1U);
  if (iVar20 - 1U == 0) {
    return 0;
  }
  goto LAB_0022ca33;
LAB_0022cbd2:
  lVar19 = lVar19 + 1;
  if (lVar19 == 4) goto code_r0x0022cbe4;
  goto LAB_0022cb52;
code_r0x0022cbe4:
  if (max_values != 0) {
    uVar21 = 0;
    do {
      pFVar6 = (FT_Fixed *)ppvVar17[uVar21];
      FVar12 = FT_RoundFix(*(FT_Fixed *)((long)pvVar11 + uVar21 * 8));
      *pFVar6 = FVar12;
      iVar20 = (int)uVar21;
      FVar12 = FT_RoundFix(*(FT_Fixed *)((long)pvVar11 + (ulong)(uint)((int)uVar13 + iVar20) * 8));
      pFVar6[1] = FVar12;
      FVar12 = FT_RoundFix(*(FT_Fixed *)((long)pvVar11 + (ulong)(uint)((int)local_70 + iVar20) * 8))
      ;
      pFVar6[2] = FVar12;
      FVar12 = FT_RoundFix(*(FT_Fixed *)((long)pvVar11 + (ulong)(uint)((int)local_78 + iVar20) * 8))
      ;
      pFVar6[3] = FVar12;
      uVar21 = uVar21 + 1;
    } while (uVar13 != uVar21);
  }
  ft_mem_free(local_b8,pvVar11);
  pTVar16 = local_d0;
  uVar13 = local_b0;
  lVar19 = local_a0;
  iVar20 = local_bc;
  goto LAB_0022ce8f;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field( PS_Parser       parser,
                        const T1_Field  field,
                        void**          objects,
                        FT_UInt         max_objects,
                        FT_ULong*       pflags )
  {
    T1_TokenRec   token;
    FT_Byte*      cur;
    FT_Byte*      limit;
    FT_UInt       count;
    FT_UInt       idx;
    FT_Error      error;
    T1_FieldType  type;


    /* this also skips leading whitespace */
    ps_parser_to_token( parser, &token );
    if ( !token.type )
      goto Fail;

    count = 1;
    idx   = 0;
    cur   = token.start;
    limit = token.limit;

    type = field->type;

    /* we must detect arrays in /FontBBox */
    if ( type == T1_FIELD_TYPE_BBOX )
    {
      T1_TokenRec  token2;
      FT_Byte*     old_cur   = parser->cursor;
      FT_Byte*     old_limit = parser->limit;


      /* don't include delimiters */
      parser->cursor = token.start + 1;
      parser->limit  = token.limit - 1;

      ps_parser_to_token( parser, &token2 );
      parser->cursor = old_cur;
      parser->limit  = old_limit;

      if ( token2.type == T1_TOKEN_TYPE_ARRAY )
      {
        type = T1_FIELD_TYPE_MM_BBOX;
        goto FieldArray;
      }
    }
    else if ( token.type == T1_TOKEN_TYPE_ARRAY )
    {
      count = max_objects;

    FieldArray:
      /* if this is an array and we have no blend, an error occurs */
      if ( max_objects == 0 )
        goto Fail;

      idx = 1;

      /* don't include delimiters */
      cur++;
      limit--;
    }

    for ( ; count > 0; count--, idx++ )
    {
      FT_Byte*    q      = (FT_Byte*)objects[idx] + field->offset;
      FT_Long     val;


      skip_spaces( &cur, limit );

      switch ( type )
      {
      case T1_FIELD_TYPE_BOOL:
        val = ps_tobool( &cur, limit );
        FT_TRACE4(( " %s", val ? "true" : "false" ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED:
        val = PS_Conv_ToFixed( &cur, limit, 0 );
        FT_TRACE4(( " %f", (double)val / 65536 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED_1000:
        val = PS_Conv_ToFixed( &cur, limit, 3 );
        FT_TRACE4(( " %f", (double)val / 65536 / 1000 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_INTEGER:
        val = PS_Conv_ToInt( &cur, limit );
        FT_TRACE4(( " %ld", val ));
        /* fall through */

      Store_Integer:
        switch ( field->size )
        {
        case (8 / FT_CHAR_BIT):
          *(FT_Byte*)q = (FT_Byte)val;
          break;

        case (16 / FT_CHAR_BIT):
          *(FT_UShort*)q = (FT_UShort)val;
          break;

        case (32 / FT_CHAR_BIT):
          *(FT_UInt32*)q = (FT_UInt32)val;
          break;

        default:                /* for 64-bit systems */
          *(FT_Long*)q = val;
        }
        break;

      case T1_FIELD_TYPE_STRING:
      case T1_FIELD_TYPE_KEY:
        {
          FT_Memory   memory = parser->memory;
          FT_UInt     len    = (FT_UInt)( limit - cur );
          FT_String*  string = NULL;


          if ( cur >= limit )
            break;

          /* we allow both a string or a name   */
          /* for cases like /FontName (foo) def */
          if ( token.type == T1_TOKEN_TYPE_KEY )
          {
            /* don't include leading `/' */
            len--;
            cur++;
          }
          else if ( token.type == T1_TOKEN_TYPE_STRING )
          {
            /* don't include delimiting parentheses    */
            /* XXX we don't handle <<...>> here        */
            /* XXX should we convert octal escapes?    */
            /*     if so, what encoding should we use? */
            cur++;
            len -= 2;
          }
          else
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected a name or string\n" ));
            FT_ERROR(( "                     "
                       " but found token of type %d instead\n",
                       token.type ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          /* for this to work (FT_String**)q must have been */
          /* initialized to NULL                            */
          if ( *(FT_String**)q )
          {
            FT_TRACE0(( "ps_parser_load_field: overwriting field %s\n",
                        field->ident ));
            FT_FREE( *(FT_String**)q );
          }

          if ( FT_QALLOC( string, len + 1 ) )
            goto Exit;

          FT_MEM_COPY( string, cur, len );
          string[len] = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( token.type == T1_TOKEN_TYPE_STRING )
            FT_TRACE4(( " (%s)", string ));
          else
            FT_TRACE4(( " /%s", string ));
#endif

          *(FT_String**)q = string;
        }
        break;

      case T1_FIELD_TYPE_BBOX:
        {
          FT_Fixed  temp[4];
          FT_BBox*  bbox = (FT_BBox*)q;
          FT_Int    result;


          result = ps_tofixedarray( &cur, limit, 4, temp, 0 );

          if ( result < 4 )
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected four integers in bounding box\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          bbox->xMin = FT_RoundFix( temp[0] );
          bbox->yMin = FT_RoundFix( temp[1] );
          bbox->xMax = FT_RoundFix( temp[2] );
          bbox->yMax = FT_RoundFix( temp[3] );

          FT_TRACE4(( " [%ld %ld %ld %ld]",
                      bbox->xMin / 65536,
                      bbox->yMin / 65536,
                      bbox->xMax / 65536,
                      bbox->yMax / 65536 ));
        }
        break;

      case T1_FIELD_TYPE_MM_BBOX:
        {
          FT_Memory  memory = parser->memory;
          FT_Fixed*  temp   = NULL;
          FT_Int     result;
          FT_UInt    i;


          if ( FT_QNEW_ARRAY( temp, max_objects * 4 ) )
            goto Exit;

          for ( i = 0; i < 4; i++ )
          {
            result = ps_tofixedarray( &cur, limit, (FT_Int)max_objects,
                                      temp + i * max_objects, 0 );
            if ( result < 0 || (FT_UInt)result < max_objects )
            {
              FT_ERROR(( "ps_parser_load_field:"
                         " expected %d integer%s in the %s subarray\n",
                         max_objects, max_objects > 1 ? "s" : "",
                         i == 0 ? "first"
                                : ( i == 1 ? "second"
                                           : ( i == 2 ? "third"
                                                      : "fourth" ) ) ));
              FT_ERROR(( "                     "
                         " of /FontBBox in the /Blend dictionary\n" ));
              error = FT_THROW( Invalid_File_Format );

              FT_FREE( temp );
              goto Exit;
            }

            skip_spaces( &cur, limit );
          }

          FT_TRACE4(( " [" ));
          for ( i = 0; i < max_objects; i++ )
          {
            FT_BBox*  bbox = (FT_BBox*)objects[i];


            bbox->xMin = FT_RoundFix( temp[i                  ] );
            bbox->yMin = FT_RoundFix( temp[i +     max_objects] );
            bbox->xMax = FT_RoundFix( temp[i + 2 * max_objects] );
            bbox->yMax = FT_RoundFix( temp[i + 3 * max_objects] );

            FT_TRACE4(( " [%ld %ld %ld %ld]",
                        bbox->xMin / 65536,
                        bbox->yMin / 65536,
                        bbox->xMax / 65536,
                        bbox->yMax / 65536 ));
          }
          FT_TRACE4(( "]" ));

          FT_FREE( temp );
        }
        break;

      default:
        /* an error occurred */
        goto Fail;
      }
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    error = FT_Err_Ok;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }